

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void duckdb::FunctionBinder::BindSortedAggregate(ClientContext *context,BoundWindowExpression *expr)

{
  vector<duckdb::BoundOrderByNode,_true> *this;
  OrderType type;
  OrderByNullType null_order;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var2;
  pointer pBVar3;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var4;
  BoundWindowExpression *args_1;
  ClientContext *args;
  bool bVar5;
  type this_00;
  pointer pSVar6;
  pointer pEVar7;
  pointer pBVar8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  vector<duckdb::LogicalType,_true> arguments;
  AggregateFunction ordered_aggregate;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1a0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_198;
  BoundWindowExpression *local_190;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_188;
  ClientContext *local_170;
  vector<duckdb::BoundOrderByNode,_true> *local_168;
  AggregateFunction local_160;
  
  local_190 = expr;
  local_170 = context;
  this_00 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
            ::operator*(&expr->aggregate);
  if ((this_00->order_dependent == ORDER_DEPENDENT) &&
     ((local_190->arg_orders).
      super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (local_190->arg_orders).
      super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_168 = &local_190->arg_orders;
    pBVar3 = (local_190->orders).
             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar8 = (local_190->orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ._M_impl.super__Vector_impl_data._M_start; pBVar8 != pBVar3; pBVar8 = pBVar8 + 1)
    {
      type = pBVar8->type;
      null_order = pBVar8->null_order;
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar8->expression);
      (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_188,pEVar7);
      local_1a0._M_head_impl =
           (Expression *)
           local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      BoundOrderByNode::BoundOrderByNode
                ((BoundOrderByNode *)&local_160,type,null_order,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_1a0);
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
      emplace_back<duckdb::BoundOrderByNode>
                (&local_168->
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
                 (BoundOrderByNode *)&local_160);
      BoundOrderByNode::~BoundOrderByNode((BoundOrderByNode *)&local_160);
      if (local_1a0._M_head_impl != (Expression *)0x0) {
        (*((local_1a0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_1a0._M_head_impl = (Expression *)0x0;
      if ((Expression *)
          local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start != (Expression *)0x0) {
        (*((BaseExpression *)
          &(local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start)->id_)->_vptr_BaseExpression[1])();
      }
    }
  }
  args = local_170;
  args_1 = local_190;
  if (((local_190->arg_orders).
       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       (local_190->arg_orders).
       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     ((local_190->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_190->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    this = &local_190->arg_orders;
    if (((local_170->config).enable_optimizer == true) &&
       (bVar5 = BoundOrderModifier::Simplify(this,&local_190->partitions), bVar5)) {
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::clear
                (&this->
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>)
      ;
      return;
    }
    make_uniq<duckdb::SortedAggregateBindData,duckdb::ClientContext&,duckdb::BoundWindowExpression&>
              ((duckdb *)&local_198,args,args_1);
    pSVar6 = unique_ptr<duckdb::SortedAggregateBindData,_std::default_delete<duckdb::SortedAggregateBindData>,_true>
             ::operator->((unique_ptr<duckdb::SortedAggregateBindData,_std::default_delete<duckdb::SortedAggregateBindData>,_true>
                           *)&local_198);
    if (pSVar6->sorted_on_args == false) {
      pBVar3 = (args_1->arg_orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pBVar8 = (args_1->arg_orders).
                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    .
                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ._M_impl.super__Vector_impl_data._M_start; pBVar8 != pBVar3; pBVar8 = pBVar8 + 1
          ) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&args_1->children,&pBVar8->expression);
      }
    }
    local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
              (&local_188,
               (long)(args_1->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(args_1->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar1 = (args_1->children).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (args_1->children).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1;
        this_01 = this_01 + 1) {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_188,
                 &pEVar7->return_type);
    }
    AggregateFunction::AggregateFunction
              (&local_160,
               &(this_00->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,
               (vector<duckdb::LogicalType,_true> *)&local_188,
               &(this_00->super_BaseScalarFunction).return_type,
               AggregateFunction::StateSize<duckdb::SortedAggregateState>,
               AggregateFunction::
               StateInitialize<duckdb::SortedAggregateState,duckdb::SortedAggregateFunction,(duckdb::AggregateDestructorType)1>
               ,SortedAggregateFunction::ScatterUpdate,
               AggregateFunction::
               StateCombine<duckdb::SortedAggregateState,duckdb::SortedAggregateFunction>,
               SortedAggregateFunction::Finalize,(this_00->super_BaseScalarFunction).null_handling,
               SortedAggregateFunction::SimpleUpdate,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::SortedAggregateState,duckdb::SortedAggregateFunction>,
               (aggregate_statistics_t)0x0,SortedAggregateFunction::Window,
               (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
    AggregateFunction::operator=(this_00,&local_160);
    _Var4._M_head_impl = local_198._M_head_impl;
    local_198._M_head_impl = (FunctionData *)0x0;
    _Var2._M_head_impl =
         (args_1->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (args_1->bind_info).
    super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var2._M_head_impl != (FunctionData *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_FunctionData[1])();
    }
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::clear
              (&this->
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>);
    AggregateFunction::~AggregateFunction(&local_160);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_188);
    if (local_198._M_head_impl != (FunctionData *)0x0) {
      (**(code **)(*(long *)local_198._M_head_impl + 8))();
    }
  }
  return;
}

Assistant:

void FunctionBinder::BindSortedAggregate(ClientContext &context, BoundWindowExpression &expr) {
	//	Make implicit orderings explicit
	auto &aggregate = *expr.aggregate;
	if (aggregate.order_dependent == AggregateOrderDependent::ORDER_DEPENDENT && expr.arg_orders.empty()) {
		for (auto &order : expr.orders) {
			const auto type = order.type;
			const auto null_order = order.null_order;
			auto expression = order.expression->Copy();
			expr.arg_orders.emplace_back(BoundOrderByNode(type, null_order, std::move(expression)));
		}
	}

	if (expr.arg_orders.empty() || expr.children.empty()) {
		// not a sorted aggregate: return
		return;
	}
	// Remove unnecessary ORDER BY clauses and return if nothing remains
	if (context.config.enable_optimizer) {
		if (BoundOrderModifier::Simplify(expr.arg_orders, expr.partitions)) {
			expr.arg_orders.clear();
			return;
		}
	}
	auto &children = expr.children;
	auto &arg_orders = expr.arg_orders;
	auto sorted_bind = make_uniq<SortedAggregateBindData>(context, expr);

	if (!sorted_bind->sorted_on_args) {
		// The arguments are the children plus the sort columns.
		for (auto &order : arg_orders) {
			children.emplace_back(std::move(order.expression));
		}
	}

	vector<LogicalType> arguments;
	arguments.reserve(children.size());
	for (const auto &child : children) {
		arguments.emplace_back(child->return_type);
	}

	// Replace the aggregate with the wrapper
	AggregateFunction ordered_aggregate(
	    aggregate.name, arguments, aggregate.return_type, AggregateFunction::StateSize<SortedAggregateState>,
	    AggregateFunction::StateInitialize<SortedAggregateState, SortedAggregateFunction,
	                                       AggregateDestructorType::LEGACY>,
	    SortedAggregateFunction::ScatterUpdate,
	    AggregateFunction::StateCombine<SortedAggregateState, SortedAggregateFunction>,
	    SortedAggregateFunction::Finalize, aggregate.null_handling, SortedAggregateFunction::SimpleUpdate, nullptr,
	    AggregateFunction::StateDestroy<SortedAggregateState, SortedAggregateFunction>, nullptr,
	    SortedAggregateFunction::Window);

	aggregate = std::move(ordered_aggregate);
	expr.bind_info = std::move(sorted_bind);
	expr.arg_orders.clear();
}